

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
* __thiscall
testing::internal::
FunctionMocker<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
::With(MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
       *__return_storage_ptr__,
      FunctionMocker<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
      *this,Matcher<int> *m,Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&> *m_1)

{
  _Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
  local_40;
  
  local_40.super__Tuple_impl<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>.
  super__Head_base<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>.vtable_ =
       (m_1->super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>).vtable_;
  local_40.super__Tuple_impl<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>.
  super__Head_base<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>.buffer_ =
       (m_1->super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>).buffer_;
  (m_1->super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>).vtable_ = (VTable *)0x0;
  local_40.super__Tuple_impl<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>.
  super__Head_base<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bd4a0;
  local_40.super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  vtable_ = (m->super_MatcherBase<int>).vtable_;
  local_40.super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  buffer_ = (m->super_MatcherBase<int>).buffer_;
  (m->super_MatcherBase<int>).vtable_ = (VTable *)0x0;
  local_40.super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bd458;
  __return_storage_ptr__->function_mocker_ = this;
  std::
  _Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>_>
  ::_Tuple_impl(&(__return_storage_ptr__->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
                ,&local_40);
  MatcherBase<int>::~MatcherBase
            ((MatcherBase<int> *)&local_40.super__Head_base<0UL,_testing::Matcher<int>,_false>);
  MatcherBase<const_pstore::gsl::span<unsigned_char,_-1L>_&>::~MatcherBase
            ((MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }